

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeMSRMask(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint64_t uVar2;
  
  uVar2 = ARM_getFeatureBits(Inst->csh->mode);
  if (((uint)uVar2 >> 0x10 & 1) == 0) {
    if (Val == 0) {
      return MCDisassembler_Fail;
    }
  }
  else {
    if (0x14 < (byte)Val) {
      return MCDisassembler_Fail;
    }
    if ((0x1103efU >> (Val & 0x1f) & 1) == 0) {
      if ((0xe0000U >> (Val & 0x1f) & 1) == 0) {
        return MCDisassembler_Fail;
      }
      if ((uVar2 & 0x40000000000) == 0) {
        return MCDisassembler_Fail;
      }
    }
    if (((uVar2 & 0x40000000000) != 0) && (uVar1 = MCInst_getOpcode(Inst), uVar1 == 0x99c)) {
      uVar1 = Val >> 10 & 3;
      if ((Val >> 10 & 3) == 0) {
        return MCDisassembler_Fail;
      }
      if ((Val & 0xfc) != 0 && uVar1 != 2) {
        return MCDisassembler_Fail;
      }
      if ((uVar1 == 1) && ((uVar2 & 0x200) == 0)) {
        return MCDisassembler_Fail;
      }
    }
  }
  MCOperand_CreateImm0(Inst,(ulong)Val);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMSRMask(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	uint64_t FeatureBits = ARM_getFeatureBits(Inst->csh->mode);
	if (FeatureBits & ARM_FeatureMClass) {
		unsigned ValLow = Val & 0xff;

		// Validate the SYSm value first.
		switch (ValLow) {
			case  0: // apsr
			case  1: // iapsr
			case  2: // eapsr
			case  3: // xpsr
			case  5: // ipsr
			case  6: // epsr
			case  7: // iepsr
			case  8: // msp
			case  9: // psp
			case 16: // primask
			case 20: // control
				break;
			case 17: // basepri
			case 18: // basepri_max
			case 19: // faultmask
				if (!(FeatureBits & ARM_HasV7Ops))
					// Values basepri, basepri_max and faultmask are only valid for v7m.
					return MCDisassembler_Fail;
				break;
			default:
				return MCDisassembler_Fail;
		}

		// The ARMv7-M architecture has an additional 2-bit mask value in the MSR
		// instruction (bits {11,10}). The mask is used only with apsr, iapsr,
		// eapsr and xpsr, it has to be 0b10 in other cases. Bit mask{1} indicates
		// if the NZCVQ bits should be moved by the instruction. Bit mask{0}
		// indicates the move for the GE{3:0} bits, the mask{0} bit can be set
		// only if the processor includes the DSP extension.
		if ((FeatureBits & ARM_HasV7Ops) && MCInst_getOpcode(Inst) == ARM_t2MSR_M) {
			unsigned Mask = (Val >> 10) & 3;
			if (Mask == 0 || (Mask != 2 && ValLow > 3) ||
					(!(FeatureBits & ARM_FeatureDSPThumb2) && Mask == 1))
				return MCDisassembler_Fail;
		}
	} else {
		// A/R class
		if (Val == 0)
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, Val);
	return MCDisassembler_Success;
}